

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O2

bool __thiscall
QHttp2ProtocolHandler::sendHEADERS
          (QHttp2ProtocolHandler *this,QHttp2Stream *stream,QHttpNetworkRequest *request)

{
  uint uVar1;
  bool bVar2;
  ProxyType PVar3;
  QHttpNetworkRequestPrivate *pQVar4;
  HeaderSize HVar5;
  qsizetype qVar6;
  QNonContiguousByteDevice *pQVar7;
  pointer pHVar8;
  storage_type *in_R8;
  qsizetype i;
  long i_00;
  uint uVar9;
  ulong uVar10;
  pointer pHVar11;
  long in_FS_OFFSET;
  QByteArrayView QVar12;
  QByteArrayView name;
  QByteArrayView value;
  HttpHeader local_118;
  QLatin1StringView local_f8;
  QLatin1StringView local_e8;
  QLatin1StringView local_d8;
  QLatin1StringView local_c8;
  QHttpHeaders requestHeader;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<char> local_78;
  vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  PVar3 = QNetworkProxy::type((QNetworkProxy *)(*(long *)(*(long *)(this + 0x30) + 8) + 0xc0));
  bVar2 = QHttpNetworkRequest::withCredentials(request);
  if (bVar2) {
    QHttpNetworkConnectionPrivate::createAuthorization
              (*(QHttpNetworkConnectionPrivate **)(*(long *)(this + 0x30) + 8),
               *(QIODevice **)(this + 0x28),request);
    pQVar4 = QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->(&request->d);
    pQVar4->needResendWithCredentials = false;
  }
  local_118.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_aaaaaaaaaaaaaaaa;
  local_118.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&DAT_aaaaaaaaaaaaaaaa;
  local_118.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&DAT_aaaaaaaaaaaaaaaa;
  uVar1 = *(uint *)(*(long *)(this + 0x38) + 0x2a4);
  local_58.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>::reserve(&local_58,300);
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d._0_4_ = 0xaaaaaaaa;
  local_78.d._4_4_ = 0xaaaaaaaa;
  local_78.ptr._0_4_ = 0xaaaaaaaa;
  local_78.ptr._4_4_ = 0xaaaaaaaa;
  (*(request->super_QHttpNetworkHeader)._vptr_QHttpNetworkHeader[2])(&local_a8,request);
  QUrl::authority(&local_90,&local_a8,0x1f00006);
  QString::toLatin1_helper_inplace((QString *)&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
  QUrl::~QUrl((QUrl *)&local_a8);
  std::vector<HPack::HeaderField,std::allocator<HPack::HeaderField>>::
  emplace_back<char_const(&)[11],QByteArray_const&>
            ((vector<HPack::HeaderField,std::allocator<HPack::HeaderField>> *)&local_58,
             (char (*) [11])":authority",(QByteArray *)&local_78);
  QHttpNetworkRequest::methodName((QByteArray *)&local_90,request);
  std::vector<HPack::HeaderField,std::allocator<HPack::HeaderField>>::
  emplace_back<char_const(&)[8],QByteArray>
            ((vector<HPack::HeaderField,std::allocator<HPack::HeaderField>> *)&local_58,
             (char (*) [8])":method",(QByteArray *)&local_90);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_90);
  QHttpNetworkRequest::uri((QByteArray *)&local_90,request,PVar3 != NoProxy);
  std::vector<HPack::HeaderField,std::allocator<HPack::HeaderField>>::
  emplace_back<char_const(&)[6],QByteArray>
            ((vector<HPack::HeaderField,std::allocator<HPack::HeaderField>> *)&local_58,
             (char (*) [6])":path",(QByteArray *)&local_90);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_90);
  (*(request->super_QHttpNetworkHeader)._vptr_QHttpNetworkHeader[2])(&local_c8,request);
  QUrl::scheme();
  QString::toLatin1_helper_inplace((QString *)&local_90);
  std::vector<HPack::HeaderField,std::allocator<HPack::HeaderField>>::
  emplace_back<char_const(&)[8],QByteArray>
            ((vector<HPack::HeaderField,std::allocator<HPack::HeaderField>> *)&local_58,
             (char (*) [8])":scheme",(QByteArray *)&local_90);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_90);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  QUrl::~QUrl((QUrl *)&local_c8);
  HVar5 = HPack::header_size((HttpHeader *)&local_58);
  if ((((ulong)HVar5 & 1) == 0) || (uVar10 = (ulong)HVar5 >> 0x20, uVar1 < HVar5.second)) {
    local_118.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_118.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pHVar8 = (pointer)0x0;
    pHVar11 = (pointer)0x0;
  }
  else {
    requestHeader.d.d.ptr = (QExplicitlySharedDataPointer<QHttpHeadersPrivate>)&DAT_aaaaaaaaaaaaaaaa
    ;
    (*(request->super_QHttpNetworkHeader)._vptr_QHttpNetworkHeader[8])(&requestHeader,request);
    i_00 = 0;
    while( true ) {
      qVar6 = QHttpHeaders::size(&requestHeader);
      if (qVar6 <= i_00) break;
      local_c8.m_data = &DAT_aaaaaaaaaaaaaaaa;
      local_c8.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_c8 = QHttpHeaders::nameAt(&requestHeader,i_00);
      QVar12 = QHttpHeaders::valueAt(&requestHeader,i_00);
      name.m_data = (storage_type *)QVar12.m_size;
      name.m_size = (qsizetype)local_c8.m_data;
      value.m_data = in_R8;
      value.m_size = (qsizetype)QVar12.m_data;
      HVar5 = HPack::entry_size((HPack *)local_c8.m_size,name,value);
      if (((ulong)HVar5 & 1) == 0) break;
      if ((~HVar5.second < (uint)uVar10) ||
         (uVar9 = (uint)uVar10 + HVar5.second, uVar10 = (ulong)uVar9, uVar1 < uVar9)) break;
      local_90.d = (Data *)0xa;
      local_90.ptr = L"connection";
      bVar2 = comparesEqual(&local_c8,(QLatin1StringView *)&local_90);
      if (!bVar2) {
        local_a8.d = (Data *)0x4;
        local_a8.ptr = L"host";
        bVar2 = comparesEqual(&local_c8,(QLatin1StringView *)&local_a8);
        if (!bVar2) {
          local_d8.m_size = 10;
          local_d8.m_data = "keep-alive";
          bVar2 = comparesEqual(&local_c8,&local_d8);
          if (!bVar2) {
            local_e8.m_size = 0x10;
            local_e8.m_data = "proxy-connection";
            bVar2 = comparesEqual(&local_c8,&local_e8);
            if (!bVar2) {
              local_f8.m_size = 0x11;
              local_f8.m_data = "transfer-encoding";
              bVar2 = comparesEqual(&local_c8,&local_f8);
              if (!bVar2) {
                QByteArray::QByteArray((QByteArray *)&local_90,local_c8.m_data,local_c8.m_size);
                QByteArray::QByteArray
                          ((QByteArray *)&local_a8,QVar12.m_data,(longlong)QVar12.m_size);
                std::vector<HPack::HeaderField,std::allocator<HPack::HeaderField>>::
                emplace_back<QByteArray,QByteArray>
                          ((vector<HPack::HeaderField,std::allocator<HPack::HeaderField>> *)
                           &local_58,(QByteArray *)&local_90,(QByteArray *)&local_a8);
                QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_a8);
                QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_90);
              }
            }
          }
        }
      }
      i_00 = i_00 + 1;
    }
    pHVar8 = local_58.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pHVar11 = local_58.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_118.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_58.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_118.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_58.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_118.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_58.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_58.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    QHttpHeaders::~QHttpHeaders(&requestHeader);
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
  std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>::~vector(&local_58);
  if (pHVar11 == pHVar8) {
    bVar2 = false;
  }
  else {
    pQVar7 = QHttpNetworkRequest::uploadByteDevice(request);
    bVar2 = QHttp2Stream::sendHEADERS
                      ((QHttp2Stream *)stream,&local_118,pQVar7 == (QNonContiguousByteDevice *)0x0,
                       '\x7f');
  }
  std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>::~vector(&local_118);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttp2ProtocolHandler::sendHEADERS(QHttp2Stream *stream, QHttpNetworkRequest &request)
{
    using namespace HPack;

    bool useProxy = false;
#ifndef QT_NO_NETWORKPROXY
    useProxy = m_connection->d_func()->networkProxy.type() != QNetworkProxy::NoProxy;
#endif
    if (request.withCredentials()) {
        m_connection->d_func()->createAuthorization(m_socket, request);
        request.d->needResendWithCredentials = false;
    }
    const auto headers = build_headers(request, h2Connection->maxHeaderListSize(), useProxy);
    if (headers.empty()) // nothing fits into maxHeaderListSize
        return false;

    bool mustUploadData = request.uploadByteDevice();
    return stream->sendHEADERS(headers, !mustUploadData);
}